

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadFuncCos<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadFuncCos<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  value_type vVar2;
  double dVar3;
  value_type vVar4;
  double dVar5;
  
  vVar2 = FadFuncCos<Fad<double>_>::dx(&this->left_->fadexpr_,i);
  dVar1 = (this->right_->fadexpr_).left_.constant_;
  dVar3 = cos((((this->right_->fadexpr_).right_)->fadexpr_).expr_.val_);
  vVar4 = FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>::dx
                    (&this->right_->fadexpr_,i);
  dVar5 = cos((this->left_->fadexpr_).expr_.val_);
  return dVar5 * vVar4 + (dVar3 + dVar1) * vVar2;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}